

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# features.c
# Opt level: O2

char * faup_features_get_string(faup_handler_t *fh,faup_features_field_t field)

{
  char *pcVar1;
  faup_feature_t feature;
  
  if (field < (FAUP_FEATURES_FIELD_PORT|FAUP_FEATURES_FIELD_DOMAIN)) {
    feature.size = *(uint32_t *)
                    ((long)&(fh->faup).org_str + *(long *)(&DAT_0011b2f8 + (ulong)field * 8));
    feature._0_8_ =
         *(undefined8 *)((long)&(fh->faup).org_str + *(long *)(&DAT_0011b298 + (ulong)field * 8));
    pcVar1 = _get_feature_string(fh,feature);
    return pcVar1;
  }
  return (char *)0x0;
}

Assistant:

char *faup_features_get_string(faup_handler_t *fh, faup_features_field_t field)
{
  char *retstring = NULL;

  switch(field) {
  case FAUP_FEATURES_FIELD_SCHEME:
    return _get_feature_string(fh, fh->faup.features.scheme);
    break;
  case FAUP_FEATURES_FIELD_HIERARCHICAL:
    return _get_feature_string(fh, fh->faup.features.hierarchical);
    break;
  case FAUP_FEATURES_FIELD_CREDENTIAL:
    return _get_feature_string(fh, fh->faup.features.credential);
    break;
  case FAUP_FEATURES_FIELD_SUBDOMAIN:
    return _get_feature_string(fh, fh->faup.features.subdomain);
    break;
  case FAUP_FEATURES_FIELD_DOMAIN:
    return _get_feature_string(fh, fh->faup.features.domain);
    break;
  case FAUP_FEATURES_FIELD_DOMAIN_WITHOUT_TLD:
    return _get_feature_string(fh, fh->faup.features.domain_without_tld);
    break;
  case FAUP_FEATURES_FIELD_HOST:
    return _get_feature_string(fh, fh->faup.features.host);
    break;
  case FAUP_FEATURES_FIELD_TLD:
    return _get_feature_string(fh, fh->faup.features.tld);
    break;
  case FAUP_FEATURES_FIELD_PORT:
    return _get_feature_string(fh, fh->faup.features.port);
    break;
  case FAUP_FEATURES_FIELD_RESOURCE_PATH:
    return _get_feature_string(fh, fh->faup.features.resource_path);
    break;
  case FAUP_FEATURES_FIELD_QUERY_STRING:
    return _get_feature_string(fh, fh->faup.features.query_string);
    break;
  case FAUP_FEATURES_FIELD_FRAGMENT:
    return _get_feature_string(fh, fh->faup.features.fragment);
    break;
  }

  return NULL;
}